

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O2

string * __thiscall llvm::Twine::str_abi_cxx11_(string *__return_storage_ptr__,Twine *this)

{
  NodeKind NVar1;
  SmallString<256U> Vec;
  StringRef local_130;
  SmallVectorImpl<char> local_120;
  undefined1 local_110 [256];
  
  NVar1 = this->RHSKind ^ EmptyKind;
  if (this->LHSKind == StdStringKind && NVar1 == NullKind) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this->LHS).twine);
  }
  else if (this->LHSKind == FormatvObjectKind && NVar1 == NullKind) {
    formatv_object_base::str_abi_cxx11_(__return_storage_ptr__,(this->LHS).formatvObject);
  }
  else {
    local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = local_110;
    local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x100;
    local_130 = toStringRef(this,&local_120);
    StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_130);
    SmallVectorImpl<char>::~SmallVectorImpl(&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Twine::str() const {
  // If we're storing only a std::string, just return it.
  if (LHSKind == StdStringKind && RHSKind == EmptyKind)
    return *LHS.stdString;

  // If we're storing a formatv_object, we can avoid an extra copy by formatting
  // it immediately and returning the result.
  if (LHSKind == FormatvObjectKind && RHSKind == EmptyKind)
    return LHS.formatvObject->str();

  // Otherwise, flatten and copy the contents first.
  SmallString<256> Vec;
  return toStringRef(Vec).str();
}